

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_group_ops
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  undefined1 (*pauVar23) [16];
  int i;
  pointer ppLVar24;
  Layer *pLVar25;
  long lVar26;
  pointer ppLVar27;
  ulong uVar28;
  void *pvVar29;
  int iVar30;
  void *in_R8;
  Allocator *pAVar31;
  long lVar32;
  bool bVar33;
  ushort uVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  ParamDict pd;
  Mat local_2b8;
  undefined1 auStack_26c [8];
  int local_264;
  uint local_260;
  int local_25c;
  undefined1 local_258 [40];
  undefined1 local_230 [16];
  int local_220 [2];
  size_t local_218;
  Allocator *local_210;
  int iStack_208;
  undefined4 uStack_204;
  size_t sStack_200;
  uint uStack_1f8;
  Allocator *local_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  size_t local_1d0;
  void *local_1c8;
  int *piStack_1c0;
  size_t sStack_1b8;
  int iStack_1b0;
  Allocator *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  int local_190;
  size_t local_188;
  void *local_180;
  int *piStack_178;
  size_t sStack_170;
  int iStack_168;
  Allocator *local_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined8 local_140;
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  size_t sStack_128;
  int iStack_120;
  Allocator *local_118;
  undefined8 local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined8 local_f8;
  undefined1 local_e8 [40];
  undefined1 local_c0 [16];
  int local_b0;
  size_t local_a8;
  undefined1 (*local_a0) [16];
  undefined1 (*local_98) [16];
  undefined1 (*local_90) [16];
  undefined1 (*local_88) [16];
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_80;
  size_t local_78;
  Allocator *local_70;
  size_t local_68;
  size_t local_60;
  Mat *local_58;
  size_t local_50;
  Option *local_48;
  ParamDict local_40;
  
  iVar2 = (this->super_ConvolutionDepthWise).num_output;
  iVar30 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w
  ;
  iVar3 = (this->super_ConvolutionDepthWise).group;
  uVar28 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar3;
  uVar28 = (long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) / (long)iVar30;
  ppLVar27 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppLVar24 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_48 = opt;
  if (0 < (int)((ulong)((long)ppLVar27 - (long)ppLVar24) >> 3)) {
    lVar32 = 0;
    do {
      if (ppLVar24[lVar32] != (Layer *)0x0) {
        (*ppLVar24[lVar32]->_vptr_Layer[1])();
      }
      lVar32 = lVar32 + 1;
      ppLVar24 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar27 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar32 < (int)((ulong)((long)ppLVar27 - (long)ppLVar24) >> 3));
  }
  local_80 = &this->group_ops;
  if (ppLVar27 != ppLVar24) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar24;
  }
  iVar4 = (this->super_ConvolutionDepthWise).group;
  i = (this->super_ConvolutionDepthWise).num_output / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_80,(long)iVar4);
  if (0 < (this->super_ConvolutionDepthWise).group) {
    local_25c = iVar30 * i *
                (((int)((long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_50 = (size_t)local_25c;
    local_60 = (size_t)i;
    local_58 = &(this->super_ConvolutionDepthWise).activation_params;
    local_88 = (undefined1 (*) [16])&local_1c8;
    local_90 = (undefined1 (*) [16])&local_1a0;
    local_98 = (undefined1 (*) [16])&local_180;
    local_a0 = (undefined1 (*) [16])&local_158;
    lVar32 = 0;
    do {
      local_258._16_8_ = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      local_258._0_8_ =
           lVar32 * local_50 * local_258._16_8_ +
           (long)(this->super_ConvolutionDepthWise).weight_data.data;
      local_258._24_4_ = (this->super_ConvolutionDepthWise).weight_data.elempack;
      local_258._32_8_ = (this->super_ConvolutionDepthWise).weight_data.allocator;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_230._4_4_ = (int)local_50;
      local_230._0_4_ = 1;
      local_230._8_8_ = 0x100000001;
      local_220[0] = 1;
      local_218 = local_50;
      Mat::clone((Mat *)local_e8,(__fn *)local_258,(void *)0x0,1,in_R8);
      piVar6 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
            if ((void *)local_258._0_8_ != (void *)0x0) {
              free((void *)local_258._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_258._32_8_)[3])();
          }
        }
      }
      local_218 = 0;
      local_258._0_8_ = (void *)0x0;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_258._16_8_ = 0;
      local_258._24_4_ = 0;
      local_230 = (undefined1  [16])0x0;
      local_220[0] = 0;
      bVar33 = (this->super_ConvolutionDepthWise).bias_term == 0;
      if (bVar33) {
        pAVar31 = (Allocator *)0x0;
        local_68 = 0;
        local_260 = 0;
        local_70 = (Allocator *)0x0;
        local_264 = 0;
        local_78 = 0;
      }
      else {
        local_68 = (this->super_ConvolutionDepthWise).bias_data.elemsize;
        pAVar31 = (Allocator *)
                  (lVar32 * local_60 * local_68 +
                  (long)(this->super_ConvolutionDepthWise).bias_data.data);
        local_260 = (this->super_ConvolutionDepthWise).bias_data.elempack;
        local_70 = (this->super_ConvolutionDepthWise).bias_data.allocator;
        local_78 = local_60;
        local_264 = i;
      }
      bVar33 = !bVar33;
      pLVar25 = create_layer_cpu(6);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,(this->super_ConvolutionDepthWise).kernel_w);
      ParamDict::set(&local_40,0xb,(this->super_ConvolutionDepthWise).kernel_h);
      ParamDict::set(&local_40,2,(this->super_ConvolutionDepthWise).dilation_w);
      ParamDict::set(&local_40,0xc,(this->super_ConvolutionDepthWise).dilation_h);
      ParamDict::set(&local_40,3,(this->super_ConvolutionDepthWise).stride_w);
      ParamDict::set(&local_40,0xd,(this->super_ConvolutionDepthWise).stride_h);
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,5,(this->super_ConvolutionDepthWise).bias_term);
      ParamDict::set(&local_40,6,local_25c);
      ParamDict::set(&local_40,8,(this->super_ConvolutionDepthWise).int8_scale_term);
      ParamDict::set(&local_40,9,(this->super_ConvolutionDepthWise).activation_type);
      ParamDict::set(&local_40,10,local_58);
      (*pLVar25->_vptr_Layer[2])(pLVar25,&local_40);
      if ((this->super_ConvolutionDepthWise).bias_term == 0) {
        lVar26 = 0x40;
        do {
          *(undefined8 *)(local_258 + lVar26) = 0;
          *(undefined1 (*) [16])((long)&local_2b8.allocator + lVar26) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_2b8.w + lVar26) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_2b8.cstep + lVar26) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(auStack_26c + lVar26) = (undefined1  [16])0x0;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 != 0x160);
        piVar6 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
              if ((void *)local_258._0_8_ != (void *)0x0) {
                free((void *)local_258._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_258._32_8_)[3])();
            }
          }
        }
        local_258._0_8_ = local_e8._0_8_;
        local_258._8_4_ = local_e8._8_4_;
        local_258._12_4_ = local_e8._12_4_;
        local_258._16_8_ = local_e8._16_8_;
        local_258._24_4_ = local_e8._24_4_;
        local_258._32_8_ = local_e8._32_8_;
        local_230 = local_c0;
        local_220[0] = local_b0;
        local_218 = local_a8;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_2b8.cstep = 0;
          local_2b8.data = (Allocator *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
          local_2b8.elempack = 0;
          local_2b8.allocator = (Allocator *)local_2b8.data;
          local_2b8.dims = (int)local_2b8.refcount;
          local_2b8.w = local_2b8.elempack;
          local_2b8._48_8_ = local_2b8.elemsize;
          local_2b8.c = local_2b8.elempack;
          Mat::create(&local_2b8,i,4,(Allocator *)0x0);
          auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < local_2b8.c * (int)local_2b8.cstep) {
            auVar37 = vpbroadcastq_avx512f();
            auVar38 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)((long)(this->super_ConvolutionDepthWise).
                                                         weight_data_int8_scales.data + lVar32 * 4))
                                );
            uVar28 = 0;
            do {
              auVar39 = vpbroadcastq_avx512f();
              auVar40 = vporq_avx512f(auVar39,auVar35);
              auVar39 = vporq_avx512f(auVar39,auVar36);
              uVar20 = vpcmpuq_avx512f(auVar39,auVar37,2);
              uVar21 = vpcmpuq_avx512f(auVar40,auVar37,2);
              bVar22 = (byte)uVar21;
              uVar34 = CONCAT11(bVar22,(byte)uVar20);
              puVar1 = (uint *)((long)(_func_int ***)local_2b8.data + uVar28 * 4);
              bVar33 = (bool)((byte)uVar20 & 1);
              bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar34 >> 2) & 1);
              bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
              bVar10 = (bool)((byte)(uVar34 >> 4) & 1);
              bVar11 = (bool)((byte)(uVar34 >> 5) & 1);
              bVar12 = (bool)((byte)(uVar34 >> 6) & 1);
              bVar13 = (bool)((byte)(uVar34 >> 7) & 1);
              bVar14 = (bool)(bVar22 >> 1 & 1);
              bVar15 = (bool)(bVar22 >> 2 & 1);
              bVar16 = (bool)(bVar22 >> 3 & 1);
              bVar17 = (bool)(bVar22 >> 4 & 1);
              bVar18 = (bool)(bVar22 >> 5 & 1);
              bVar19 = (bool)(bVar22 >> 6 & 1);
              *puVar1 = (uint)bVar33 * auVar38._0_4_ | (uint)!bVar33 * *puVar1;
              puVar1[1] = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * puVar1[1];
              puVar1[2] = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * puVar1[2];
              puVar1[3] = (uint)bVar9 * auVar38._12_4_ | (uint)!bVar9 * puVar1[3];
              puVar1[4] = (uint)bVar10 * auVar38._16_4_ | (uint)!bVar10 * puVar1[4];
              puVar1[5] = (uint)bVar11 * auVar38._20_4_ | (uint)!bVar11 * puVar1[5];
              puVar1[6] = (uint)bVar12 * auVar38._24_4_ | (uint)!bVar12 * puVar1[6];
              puVar1[7] = (uint)bVar13 * auVar38._28_4_ | (uint)!bVar13 * puVar1[7];
              puVar1[8] = (uint)(bVar22 & 1) * auVar38._32_4_ |
                          (uint)!(bool)(bVar22 & 1) * puVar1[8];
              puVar1[9] = (uint)bVar14 * auVar38._36_4_ | (uint)!bVar14 * puVar1[9];
              puVar1[10] = (uint)bVar15 * auVar38._40_4_ | (uint)!bVar15 * puVar1[10];
              puVar1[0xb] = (uint)bVar16 * auVar38._44_4_ | (uint)!bVar16 * puVar1[0xb];
              puVar1[0xc] = (uint)bVar17 * auVar38._48_4_ | (uint)!bVar17 * puVar1[0xc];
              puVar1[0xd] = (uint)bVar18 * auVar38._52_4_ | (uint)!bVar18 * puVar1[0xd];
              puVar1[0xe] = (uint)bVar19 * auVar38._56_4_ | (uint)!bVar19 * puVar1[0xe];
              puVar1[0xf] = (uint)(bVar22 >> 7) * auVar38._60_4_ |
                            (uint)!(bool)(bVar22 >> 7) * puVar1[0xf];
              uVar28 = uVar28 + 0x10;
            } while ((local_2b8.c * (int)local_2b8.cstep + 0xfU & 0xfffffff0) != uVar28);
          }
          piVar6 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = (int *)CONCAT44(uStack_204,iStack_208);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_1f0 == (Allocator *)0x0) {
                if (local_210 != (Allocator *)0x0) {
                  free(local_210);
                }
              }
              else {
                (*local_1f0->_vptr_Allocator[3])();
              }
            }
          }
          local_210 = (Allocator *)local_2b8.data;
          iStack_208 = (int)local_2b8.refcount;
          uStack_204 = local_2b8.refcount._4_4_;
          sStack_200 = local_2b8.elemsize;
          uStack_1f8 = local_2b8.elempack;
          local_1f0 = local_2b8.allocator;
          local_1e8._4_4_ = local_2b8.w;
          local_1e8._0_4_ = local_2b8.dims;
          local_1e8._8_4_ = local_2b8.h;
          local_1e8._12_4_ = local_2b8.d;
          local_1d8 = local_2b8.c;
          local_1d0 = local_2b8.cstep;
          sVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pvVar29 = (void *)(sVar5 * lVar32 +
                            (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar2 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar31 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (void *)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          pauVar23 = local_88;
          *(undefined1 (*) [16])(*local_88 + 0xc) = (undefined1  [16])0x0;
          *pauVar23 = (undefined1  [16])0x0;
          pauVar23 = local_90;
          *local_90 = (undefined1  [16])0x0;
          *(undefined4 *)pauVar23[1] = 0;
          piStack_1c0 = (int *)0x0;
          local_1a0 = 0x100000001;
          uStack_198 = 0x100000001;
          local_190 = 1;
          local_188 = 1;
          piVar6 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          local_1c8 = pvVar29;
          sStack_1b8 = sVar5;
          iStack_1b0 = iVar2;
          local_1a8 = pAVar31;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2b8.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_2b8.data != (Allocator *)0x0) {
                  free(local_2b8.data);
                }
              }
              else {
                (*(local_2b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize = 0;
          local_2b8.elempack = 0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar29 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar2 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar31 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (Allocator *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (*local_160->_vptr_Allocator[3])();
              }
            }
          }
          pauVar23 = local_98;
          *(undefined1 (*) [16])(*local_98 + 0xc) = (undefined1  [16])0x0;
          *pauVar23 = (undefined1  [16])0x0;
          pauVar23 = local_a0;
          *local_a0 = (undefined1  [16])0x0;
          *(undefined4 *)pauVar23[1] = 0;
          piStack_178 = (int *)0x0;
          local_158 = 1;
          uStack_154 = 1;
          uStack_150 = 1;
          uStack_14c = 1;
          local_148 = 1;
          local_140 = 1;
          local_180 = (void *)(sVar5 * lVar32 + (long)pvVar29);
          sStack_170 = sVar5;
          iStack_168 = iVar2;
          local_160 = pAVar31;
        }
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2b8,(Mat *)local_258);
        (*pLVar25->_vptr_Layer[3])(pLVar25,&local_2b8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2b8);
        lVar26 = 0xd8;
        do {
          piVar6 = *(int **)(local_258 + lVar26 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_230 + lVar26 + -8) == (long *)0x0) {
                if (*(void **)(local_258 + lVar26) != (void *)0x0) {
                  free(*(void **)(local_258 + lVar26));
                }
              }
              else {
                (**(code **)(**(long **)(local_230 + lVar26 + -8) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_218 + lVar26) = 0;
          *(undefined1 (*) [16])(local_258 + lVar26 + 0xc) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(local_258 + lVar26) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(local_230 + lVar26) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_220 + lVar26) = 0;
          lVar26 = lVar26 + -0x48;
        } while (lVar26 != -0x48);
      }
      else {
        lVar26 = 0x40;
        do {
          *(undefined8 *)(local_258 + lVar26) = 0;
          *(undefined1 (*) [16])((long)&local_2b8.allocator + lVar26) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_2b8.w + lVar26) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_2b8.cstep + lVar26) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(auStack_26c + lVar26) = (undefined1  [16])0x0;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 != 0x1a8);
        piVar6 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
              if ((void *)local_258._0_8_ != (void *)0x0) {
                free((void *)local_258._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_258._32_8_)[3])();
            }
          }
        }
        local_258._0_8_ = local_e8._0_8_;
        local_258._8_4_ = local_e8._8_4_;
        local_258._12_4_ = local_e8._12_4_;
        local_258._16_8_ = local_e8._16_8_;
        local_258._24_4_ = local_e8._24_4_;
        local_258._32_8_ = local_e8._32_8_;
        local_230 = local_c0;
        local_220[0] = local_b0;
        local_218 = local_a8;
        piVar6 = (int *)CONCAT44(uStack_204,iStack_208);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1f0 == (Allocator *)0x0) {
              if (local_210 != (Allocator *)0x0) {
                free(local_210);
              }
            }
            else {
              (*local_1f0->_vptr_Allocator[3])();
            }
          }
        }
        iStack_208 = 0;
        uStack_204 = 0;
        sStack_200 = local_68;
        uStack_1f8 = local_260;
        local_1f0 = local_70;
        local_1d8 = CONCAT31(0,bVar33);
        local_1e8._4_4_ = local_264;
        local_1e8._0_4_ = local_1d8;
        local_1e8[8] = bVar33;
        local_1e8._9_3_ = 0;
        local_1e8[0xc] = bVar33;
        local_1e8._13_3_ = 0;
        local_1d0 = local_78;
        local_210 = pAVar31;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize = 0;
          local_2b8.elempack = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
          local_2b8.allocator = (Allocator *)0x0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          Mat::create(&local_2b8,i,4,(Allocator *)0x0);
          auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < local_2b8.c * (int)local_2b8.cstep) {
            auVar37 = vpbroadcastq_avx512f();
            auVar38 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)((long)(this->super_ConvolutionDepthWise).
                                                         weight_data_int8_scales.data + lVar32 * 4))
                                );
            uVar28 = 0;
            do {
              auVar39 = vpbroadcastq_avx512f();
              auVar40 = vporq_avx512f(auVar39,auVar35);
              auVar39 = vporq_avx512f(auVar39,auVar36);
              uVar20 = vpcmpuq_avx512f(auVar39,auVar37,2);
              uVar21 = vpcmpuq_avx512f(auVar40,auVar37,2);
              bVar22 = (byte)uVar21;
              uVar34 = CONCAT11(bVar22,(byte)uVar20);
              puVar1 = (uint *)((long)local_2b8.data + uVar28 * 4);
              bVar33 = (bool)((byte)uVar20 & 1);
              bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar34 >> 2) & 1);
              bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
              bVar10 = (bool)((byte)(uVar34 >> 4) & 1);
              bVar11 = (bool)((byte)(uVar34 >> 5) & 1);
              bVar12 = (bool)((byte)(uVar34 >> 6) & 1);
              bVar13 = (bool)((byte)(uVar34 >> 7) & 1);
              bVar14 = (bool)(bVar22 >> 1 & 1);
              bVar15 = (bool)(bVar22 >> 2 & 1);
              bVar16 = (bool)(bVar22 >> 3 & 1);
              bVar17 = (bool)(bVar22 >> 4 & 1);
              bVar18 = (bool)(bVar22 >> 5 & 1);
              bVar19 = (bool)(bVar22 >> 6 & 1);
              *puVar1 = (uint)bVar33 * auVar38._0_4_ | (uint)!bVar33 * *puVar1;
              puVar1[1] = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * puVar1[1];
              puVar1[2] = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * puVar1[2];
              puVar1[3] = (uint)bVar9 * auVar38._12_4_ | (uint)!bVar9 * puVar1[3];
              puVar1[4] = (uint)bVar10 * auVar38._16_4_ | (uint)!bVar10 * puVar1[4];
              puVar1[5] = (uint)bVar11 * auVar38._20_4_ | (uint)!bVar11 * puVar1[5];
              puVar1[6] = (uint)bVar12 * auVar38._24_4_ | (uint)!bVar12 * puVar1[6];
              puVar1[7] = (uint)bVar13 * auVar38._28_4_ | (uint)!bVar13 * puVar1[7];
              puVar1[8] = (uint)(bVar22 & 1) * auVar38._32_4_ |
                          (uint)!(bool)(bVar22 & 1) * puVar1[8];
              puVar1[9] = (uint)bVar14 * auVar38._36_4_ | (uint)!bVar14 * puVar1[9];
              puVar1[10] = (uint)bVar15 * auVar38._40_4_ | (uint)!bVar15 * puVar1[10];
              puVar1[0xb] = (uint)bVar16 * auVar38._44_4_ | (uint)!bVar16 * puVar1[0xb];
              puVar1[0xc] = (uint)bVar17 * auVar38._48_4_ | (uint)!bVar17 * puVar1[0xc];
              puVar1[0xd] = (uint)bVar18 * auVar38._52_4_ | (uint)!bVar18 * puVar1[0xd];
              puVar1[0xe] = (uint)bVar19 * auVar38._56_4_ | (uint)!bVar19 * puVar1[0xe];
              puVar1[0xf] = (uint)(bVar22 >> 7) * auVar38._60_4_ |
                            (uint)!(bool)(bVar22 >> 7) * puVar1[0xf];
              uVar28 = uVar28 + 0x10;
            } while ((local_2b8.c * (int)local_2b8.cstep + 0xfU & 0xfffffff0) != uVar28);
          }
          piVar6 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (void *)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          pauVar23 = local_88;
          *(undefined1 (*) [16])(*local_88 + 0xc) = (undefined1  [16])0x0;
          *pauVar23 = (undefined1  [16])0x0;
          pauVar23 = local_90;
          *local_90 = (undefined1  [16])0x0;
          *(undefined4 *)pauVar23[1] = 0;
          piStack_1c0 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          local_1c8 = local_2b8.data;
          sStack_1b8 = local_2b8.elemsize;
          iStack_1b0 = local_2b8.elempack;
          local_1a8 = local_2b8.allocator;
          local_1a0._4_4_ = local_2b8.w;
          local_1a0._0_4_ = local_2b8.dims;
          uStack_198._0_4_ = local_2b8.h;
          uStack_198._4_4_ = local_2b8.d;
          local_190 = local_2b8.c;
          local_188 = local_2b8.cstep;
          sVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pvVar29 = (void *)(sVar5 * lVar32 +
                            (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar2 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar31 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (Allocator *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (*local_160->_vptr_Allocator[3])();
              }
            }
          }
          pauVar23 = local_98;
          *(undefined1 (*) [16])(*local_98 + 0xc) = (undefined1  [16])0x0;
          *pauVar23 = (undefined1  [16])0x0;
          pauVar23 = local_a0;
          *local_a0 = (undefined1  [16])0x0;
          *(undefined4 *)pauVar23[1] = 0;
          piStack_178 = (int *)0x0;
          local_158 = 1;
          uStack_154 = 1;
          uStack_150 = 1;
          uStack_14c = 1;
          local_148 = 1;
          local_140 = 1;
          piVar6 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
          local_180 = pvVar29;
          sStack_170 = sVar5;
          iStack_168 = iVar2;
          local_160 = pAVar31;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2b8.allocator == (Allocator *)0x0) {
                if (local_2b8.data != (void *)0x0) {
                  free(local_2b8.data);
                }
              }
              else {
                (*(local_2b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize = 0;
          local_2b8.elempack = 0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar29 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar2 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar31 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          piVar6 = (int *)CONCAT44(uStack_12c,uStack_130);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_118 == (Allocator *)0x0) {
                if (local_138 != (void *)0x0) {
                  free(local_138);
                }
              }
              else {
                (*local_118->_vptr_Allocator[3])();
              }
            }
          }
          uStack_130 = 0;
          uStack_12c = 0;
          uStack_108 = 1;
          local_110 = 0x100000001;
          uStack_104 = 1;
          local_100 = 1;
          local_f8 = 1;
          local_138 = (void *)(sVar5 * lVar32 + (long)pvVar29);
          sStack_128 = sVar5;
          iStack_120 = iVar2;
          local_118 = pAVar31;
        }
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2b8,(Mat *)local_258);
        (*pLVar25->_vptr_Layer[3])(pLVar25,&local_2b8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2b8);
        lVar26 = 0x120;
        do {
          piVar6 = *(int **)(local_258 + lVar26 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_230 + lVar26 + -8) == (long *)0x0) {
                if (*(void **)(local_258 + lVar26) != (void *)0x0) {
                  free(*(void **)(local_258 + lVar26));
                }
              }
              else {
                (**(code **)(**(long **)(local_230 + lVar26 + -8) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_218 + lVar26) = 0;
          *(undefined1 (*) [16])(local_258 + lVar26 + 0xc) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(local_258 + lVar26) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(local_230 + lVar26) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_220 + lVar26) = 0;
          lVar26 = lVar26 + -0x48;
        } while (lVar26 != -0x48);
      }
      (*pLVar25->_vptr_Layer[4])(pLVar25,local_48);
      (local_80->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar32] = pLVar25;
      ParamDict::~ParamDict(&local_40);
      piVar6 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if ((Allocator *)local_e8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_e8._0_8_ != (void *)0x0) {
              free((void *)local_e8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_e8._32_8_)[3])();
          }
        }
      }
      local_a8 = 0;
      local_e8._0_8_ = (void *)0x0;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      local_e8._16_8_ = 0;
      local_e8._24_4_ = 0;
      local_c0 = (undefined1  [16])0x0;
      local_b0 = 0;
      lVar32 = lVar32 + 1;
    } while (lVar32 < (this->super_ConvolutionDepthWise).group);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}